

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txmempool.cpp
# Opt level: O1

void __thiscall CTxMemPool::RemoveUnbroadcastTx(CTxMemPool *this,uint256 *txid,bool unchecked)

{
  size_t sVar1;
  bool bVar2;
  Logger *this_00;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file;
  pair<std::_Rb_tree_iterator<uint256>,_std::_Rb_tree_iterator<uint256>_> pVar3;
  char *local_68;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock16;
  string local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  criticalblock16.super_unique_lock._M_device = &(this->cs).super_recursive_mutex;
  criticalblock16.super_unique_lock._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&criticalblock16.super_unique_lock);
  pVar3 = std::
          _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
          ::equal_range(&(this->m_unbroadcast_txids)._M_t,txid);
  sVar1 = (this->m_unbroadcast_txids)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  std::
  _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
  ::_M_erase_aux(&(this->m_unbroadcast_txids)._M_t,(_Base_ptr)pVar3.first._M_node,
                 (_Base_ptr)pVar3.second._M_node);
  if (sVar1 != (this->m_unbroadcast_txids)._M_t._M_impl.super__Rb_tree_header._M_node_count) {
    this_00 = LogInstance();
    bVar2 = BCLog::Logger::WillLogCategoryLevel(this_00,MEMPOOL,Debug);
    if (bVar2) {
      base_blob<256u>::GetHex_abi_cxx11_(&local_50,txid);
      local_68 = "";
      if (unchecked) {
        local_68 = " before confirmation that txn was sent out";
      }
      logging_function._M_str = "RemoveUnbroadcastTx";
      logging_function._M_len = 0x13;
      source_file._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/txmempool.cpp";
      source_file._M_len = 0x56;
      LogPrintf_<std::__cxx11::string,char_const*>
                (logging_function,source_file,0x40f,MEMPOOL,Debug,
                 "Removed %i from set of unbroadcast txns%s\n",&local_50,&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock16.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CTxMemPool::RemoveUnbroadcastTx(const uint256& txid, const bool unchecked) {
    LOCK(cs);

    if (m_unbroadcast_txids.erase(txid))
    {
        LogDebug(BCLog::MEMPOOL, "Removed %i from set of unbroadcast txns%s\n", txid.GetHex(), (unchecked ? " before confirmation that txn was sent out" : ""));
    }
}